

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

hittable_list * simple_light(void)

{
  hittable_list *in_RDI;
  shared_ptr<diffuse_light> local_18c;
  int local_17c;
  shared_ptr<xy_rect> local_178;
  shared_ptr<hittable> local_168;
  undefined1 local_154 [28];
  undefined1 local_138 [32];
  vec3 local_118;
  undefined1 local_100 [24];
  shared_ptr<diffuse_light> difflight;
  undefined1 local_cc [28];
  undefined1 local_b0 [32];
  shared_ptr<lambertian> local_90;
  undefined1 local_7c [28];
  undefined1 local_60 [52];
  undefined4 local_2c;
  undefined1 local_28 [8];
  shared_ptr<noise_texture> pertext;
  hittable_list *objects;
  
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  hittable_list::hittable_list(in_RDI);
  local_2c = 4;
  std::make_shared<noise_texture,int>((int *)local_28);
  vec3::vec3((vec3 *)(local_7c + 4),0.0,-1000.0,0.0);
  local_7c._0_4_ = 1000;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)&local_90);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)local_60,(int *)(local_7c + 4),(shared_ptr<lambertian> *)local_7c);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_60 + 0x10),(shared_ptr<sphere> *)local_60);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_60 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_60 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_60);
  std::shared_ptr<lambertian>::~shared_ptr(&local_90);
  vec3::vec3((vec3 *)(local_cc + 4),0.0,2.0,0.0);
  local_cc._0_4_ = 2;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)
             &difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)local_b0,(int *)(local_cc + 4),(shared_ptr<lambertian> *)local_cc);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_b0 + 0x10),(shared_ptr<sphere> *)local_b0);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_b0 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_b0 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_b0);
  std::shared_ptr<lambertian>::~shared_ptr
            ((shared_ptr<lambertian> *)
             &difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_118,4.0,4.0,4.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_100);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_100 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_100);
  vec3::vec3((vec3 *)(local_154 + 4),0.0,7.0,0.0);
  local_154._0_4_ = 2;
  std::make_shared<sphere,vec3,int,std::shared_ptr<diffuse_light>&>
            ((vec3 *)local_138,(int *)(local_154 + 4),(shared_ptr<diffuse_light> *)local_154);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_138 + 0x10),(shared_ptr<sphere> *)local_138);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_138 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_138 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_138);
  local_17c = 3;
  local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       5;
  local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       1;
  local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 3;
  local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xfffffffe;
  std::make_shared<xy_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_178,&local_17c,
             (int *)((long)&local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_18c.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_18c);
  std::shared_ptr<hittable>::shared_ptr<xy_rect,void>(&local_168,&local_178);
  hittable_list::add(in_RDI,&local_168);
  std::shared_ptr<hittable>::~shared_ptr(&local_168);
  std::shared_ptr<xy_rect>::~shared_ptr(&local_178);
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<diffuse_light>::~shared_ptr((shared_ptr<diffuse_light> *)(local_100 + 0x10));
  std::shared_ptr<noise_texture>::~shared_ptr((shared_ptr<noise_texture> *)local_28);
  if ((pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
      & 1) == 0) {
    hittable_list::~hittable_list(in_RDI);
  }
  return in_RDI;
}

Assistant:

hittable_list simple_light() {
    hittable_list objects;

    auto pertext = make_shared<noise_texture>(4);
    objects.add(make_shared<sphere>(vec3(0,-1000, 0), 1000, make_shared<lambertian>(pertext)));
    objects.add(make_shared<sphere>(vec3(0,2,0), 2, make_shared<lambertian>(pertext)));

    auto difflight = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(4,4,4)));
    objects.add(make_shared<sphere>(vec3(0,7,0), 2, difflight));
    objects.add(make_shared<xy_rect>(3, 5, 1, 3, -2, difflight));

    return objects;
}